

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::detail::option::option(option *this,option *param_2)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RSI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40,in_RSI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60,in_RSI + 0x60);
  in_RDI[0x80] = (string)((byte)in_RSI[0x80] & 1);
  return;
}

Assistant:

bool matches_short(std::string const& s) const {
                return s == ("-" + short_form);
            }